

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

Attribute * __thiscall Assimp::CFIReaderImpl::getAttributeByName(CFIReaderImpl *this,char *name)

{
  Attribute *pAVar1;
  long *__s2;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  Attribute *pAVar7;
  string n;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  if (name == (char *)0x0) {
    pAVar7 = (Attribute *)0x0;
  }
  else {
    local_50 = local_40;
    sVar3 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar3);
    __s2 = local_50;
    pAVar1 = (this->attributes).
             super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (int)((long)(this->attributes).
                        super__Vector_base<Assimp::CFIReaderImpl::Attribute,_std::allocator<Assimp::CFIReaderImpl::Attribute>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4) * 0x38e38e39
    ;
    if ((int)uVar4 < 1) {
      pAVar7 = (Attribute *)0x0;
    }
    else {
      uVar5 = (ulong)(uVar4 & 0x7fffffff);
      lVar6 = 0;
      pAVar7 = pAVar1;
      do {
        if ((pAVar7->name)._M_string_length == local_48) {
          if (local_48 == 0) {
            pAVar7 = pAVar1 + lVar6;
            goto LAB_005b5bdb;
          }
          iVar2 = bcmp((pAVar7->name)._M_dataplus._M_p,__s2,local_48);
          if (iVar2 == 0) goto LAB_005b5bdb;
        }
        lVar6 = lVar6 + 1;
        pAVar7 = pAVar7 + 1;
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
      pAVar7 = (Attribute *)0x0;
    }
LAB_005b5bdb:
    if (__s2 != local_40) {
      operator_delete(__s2,local_40[0] + 1);
    }
  }
  return pAVar7;
}

Assistant:

const Attribute* getAttributeByName(const char* name) const {
        if (!name) {
            return 0;
        }
        std::string n = name;
        for (int i=0; i<(int)attributes.size(); ++i) {
            if (attributes[i].name == n) {
                return &attributes[i];
            }
        }
        return 0;
    }